

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O2

void __thiscall OpenMD::DirectionalAtom::setPrevA(DirectionalAtom *this,RotMat3x3d *a)

{
  bool bVar1;
  RotMat3x3d atrans;
  RectMatrix<double,_3U,_3U> RStack_f8;
  RectMatrix<double,_3U,_3U> local_b0;
  SquareMatrix3<double> local_68;
  
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)
             ((long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x48 +
             *(long *)((long)&(((this->super_Atom).super_StuntDouble.snapshotMan_)->
                               previousSnapshot_->atomData).aMat.
                              super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (this->super_Atom).super_StuntDouble.storage_)),
             (RectMatrix<double,_3U,_3U> *)a);
  bVar1 = AtomType::isMultipole((this->super_Atom).atomType_);
  if (bVar1) {
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&RStack_f8,a);
    bVar1 = AtomType::isDipole((this->super_Atom).atomType_);
    if (bVar1) {
      operator*((Vector<double,_3U> *)&local_b0,&RStack_f8,&(this->dipole_).super_Vector<double,_3U>
               );
      Vector3<double>::operator=
                ((Vector3<double> *)
                 ((long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x18 +
                 *(long *)((long)&(((this->super_Atom).super_StuntDouble.snapshotMan_)->
                                   previousSnapshot_->atomData).dipole.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (this->super_Atom).super_StuntDouble.storage_)),
                 (Vector<double,_3U> *)&local_b0);
    }
    bVar1 = AtomType::isQuadrupole((this->super_Atom).atomType_);
    if (bVar1) {
      operator*(&local_68,(SquareMatrix3<double> *)&RStack_f8,&this->quadrupole_);
      operator*((SquareMatrix3<double> *)&local_b0,&local_68,a);
      RectMatrix<double,_3U,_3U>::operator=
                ((RectMatrix<double,_3U,_3U> *)
                 ((long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x48 +
                 *(long *)((long)&(((this->super_Atom).super_StuntDouble.snapshotMan_)->
                                   previousSnapshot_->atomData).quadrupole.
                                  super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (this->super_Atom).super_StuntDouble.storage_)),&local_b0);
    }
  }
  return;
}

Assistant:

void DirectionalAtom::setPrevA(const RotMat3x3d& a) {
    ((snapshotMan_->getPrevSnapshot())->*storage_).aMat[localIndex_] = a;

    if (atomType_->isMultipole()) {
      RotMat3x3d atrans = a.transpose();

      if (atomType_->isDipole()) {
        ((snapshotMan_->getPrevSnapshot())->*storage_).dipole[localIndex_] =
            atrans * dipole_;
      }

      if (atomType_->isQuadrupole()) {
        ((snapshotMan_->getPrevSnapshot())->*storage_).quadrupole[localIndex_] =
            atrans * quadrupole_ * a;
      }
    }
  }